

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

double __thiscall smf::MidiFile::linearSecondInterpolationAtTick(MidiFile *this,int ticktime)

{
  double dVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  double xi;
  double y2;
  double y1;
  double x2;
  double x1;
  int startindex;
  double lasttick;
  int i;
  int ticktime_local;
  MidiFile *this_local;
  
  if (((this->m_timemapvalid & 1U) == 0) && (buildTimeMap(this), (this->m_timemapvalid & 1U) == 0))
  {
    this_local = (MidiFile *)0xbff0000000000000;
  }
  else {
    sVar4 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size(&this->m_timemap);
    pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                       (&this->m_timemap,sVar4 - 1);
    iVar2 = pvVar5->tick;
    if (0.0 <= (double)ticktime) {
      pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::back(&this->m_timemap);
      if (pvVar5->tick < ticktime) {
        this_local = (MidiFile *)0xbff0000000000000;
      }
      else {
        x1._4_4_ = -1;
        if ((double)iVar2 / 2.0 <= (double)ticktime) {
          sVar4 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                            (&this->m_timemap);
          lasttick._0_4_ = (int)sVar4;
          do {
            lasttick._0_4_ = lasttick._0_4_ + -1;
            if (lasttick._0_4_ < 1) goto LAB_0013bd27;
            pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttick._0_4_);
            if (pvVar5->tick < ticktime) {
              x1._4_4_ = lasttick._0_4_;
              goto LAB_0013bd27;
            }
            pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttick._0_4_);
          } while (pvVar5->tick != ticktime);
          x1._4_4_ = lasttick._0_4_;
        }
        else {
          for (lasttick._0_4_ = 0;
              sVar4 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                                (&this->m_timemap), lasttick._0_4_ < (int)sVar4;
              lasttick._0_4_ = lasttick._0_4_ + 1) {
            pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttick._0_4_);
            if (ticktime < pvVar5->tick) {
              x1._4_4_ = lasttick._0_4_ + -1;
              break;
            }
            pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)lasttick._0_4_);
            if (pvVar5->tick == ticktime) {
              x1._4_4_ = lasttick._0_4_;
              break;
            }
          }
        }
LAB_0013bd27:
        if (x1._4_4_ < 0) {
          this_local = (MidiFile *)0xbff0000000000000;
        }
        else {
          sVar4 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::size
                            (&this->m_timemap);
          if (x1._4_4_ < (int)sVar4 + -1) {
            pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                               (&this->m_timemap,(long)x1._4_4_);
            if (pvVar5->tick == ticktime) {
              pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                 (&this->m_timemap,(long)x1._4_4_);
              this_local = (MidiFile *)pvVar5->seconds;
            }
            else {
              pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                 (&this->m_timemap,(long)x1._4_4_);
              iVar2 = pvVar5->tick;
              pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                 (&this->m_timemap,(long)(x1._4_4_ + 1));
              iVar3 = pvVar5->tick;
              pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                 (&this->m_timemap,(long)x1._4_4_);
              dVar1 = pvVar5->seconds;
              pvVar5 = std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::operator[]
                                 (&this->m_timemap,(long)(x1._4_4_ + 1));
              this_local = (MidiFile *)
                           (((double)ticktime - (double)iVar2) *
                            ((pvVar5->seconds - dVar1) / ((double)iVar3 - (double)iVar2)) + dVar1);
            }
          }
          else {
            this_local = (MidiFile *)0xbff0000000000000;
          }
        }
      }
    }
    else {
      this_local = (MidiFile *)0xbff0000000000000;
    }
  }
  return (double)this_local;
}

Assistant:

double MidiFile::linearSecondInterpolationAtTick(int ticktime) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	int i;
	double lasttick = m_timemap[m_timemap.size()-1].tick;
	// give an error value of -1 if time is out of range of data.
	if (ticktime < 0.0) {
		return -1;
	}
	if (ticktime > m_timemap.back().tick) {
		return -1;  // don't try to extrapolate
	}

	// Guess which side of the list is closest to target:
	// Could do a more efficient algorithm since time values are sorted,
	// but good enough for now...
	int startindex = -1;
	if (ticktime < lasttick / 2) {
		for (i=0; i<(int)m_timemap.size(); i++) {
			if (m_timemap[i].tick > ticktime) {
				startindex = i-1;
				break;
			} else if (m_timemap[i].tick == ticktime) {
				startindex = i;
				break;
			}
		}
	} else {
		for (i=(int)m_timemap.size()-1; i>0; i--) {
			if (m_timemap[i].tick < ticktime) {
				startindex = i;
				break;
			} else if (m_timemap[i].tick == ticktime) {
				startindex = i;
				break;
			}
		}
	}

	if (startindex < 0) {
		return -1;
	}
	if (startindex >= (int)m_timemap.size()-1) {
		return -1;
	}

	if (m_timemap[startindex].tick == ticktime) {
		return m_timemap[startindex].seconds;
	}

	double x1 = m_timemap[startindex].tick;
	double x2 = m_timemap[startindex+1].tick;
	double y1 = m_timemap[startindex].seconds;
	double y2 = m_timemap[startindex+1].seconds;
	double xi = ticktime;

	return (xi-x1) * ((y2-y1)/(x2-x1)) + y1;
}